

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

void connection_dowork(CONNECTION_HANDLE connection)

{
  uint64_t uVar1;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (connection == (CONNECTION_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                 ,"connection_dowork",0x72f,1,"NULL connection");
      return;
    }
  }
  else {
    uVar1 = connection_handle_deadlines(connection);
    if (uVar1 != 0) {
      xio_dowork(connection->io);
      return;
    }
  }
  return;
}

Assistant:

void connection_dowork(CONNECTION_HANDLE connection)
{
    /* Codes_S_R_S_CONNECTION_01_078: [If handle is NULL, connection_dowork shall do nothing.] */
    if (connection == NULL)
    {
        LogError("NULL connection");
    }
    else
    {
        if (connection_handle_deadlines(connection) > 0)
        {
            /* Codes_S_R_S_CONNECTION_01_076: [connection_dowork shall schedule the underlying IO interface to do its work by calling xio_dowork.] */
            xio_dowork(connection->io);
        }
    }
}